

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

void Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<const_char>_>::
     reallocate(BasicStringView<const_char> **array,size_t param_2,size_t newCapacity)

{
  ulong *puVar1;
  ostream *output;
  Debug *pDVar2;
  ulong __size;
  Error EStack_38;
  
  __size = newCapacity << 4 | 8;
  puVar1 = (ulong *)realloc(&(*array)[-1]._sizePlusFlags,__size);
  if (puVar1 != (ulong *)0x0) {
    *puVar1 = __size;
    *array = (BasicStringView<const_char> *)(puVar1 + 1);
    return;
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&EStack_38,output,(Flags)0x0);
  pDVar2 = Utility::Debug::operator<<
                     (&EStack_38.super_Debug,"Containers::ArrayMallocAllocator: can\'t reallocate");
  pDVar2 = Utility::Debug::operator<<(pDVar2,__size);
  Utility::Debug::operator<<(pDVar2,"bytes");
  Utility::Error::~Error(&EStack_38);
  abort();
}

Assistant:

void ArrayMallocAllocator<T>::reallocate(T*& array, std::size_t, const std::size_t newCapacity) {
    const std::size_t inBytes = newCapacity*sizeof(T) + AllocationOffset;
    char* const memory = static_cast<char*>(std::realloc(reinterpret_cast<char*>(array) - AllocationOffset, inBytes));
    CORRADE_ASSERT(memory,
        "Containers::ArrayMallocAllocator: can't reallocate" << inBytes << "bytes", );
    reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
    array = reinterpret_cast<T*>(memory + AllocationOffset);
}